

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

void * __thiscall lan::db::operator[](db *this,string *context)

{
  pointer pcVar1;
  void *pvVar2;
  db_bits *pdVar3;
  string local_38;
  
  pcVar1 = (context->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + context->_M_string_length);
  pdVar3 = find_rec(this,&local_38,Container,this->first);
  pvVar2 = pdVar3->data;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pvVar2;
}

Assistant:

void * db::operator[](std::string const context){
            return find_rec(context, lan::Container, first)->data;
        }